

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O1

int secp256k1_der_parse_integer(secp256k1_scalar *r,uchar **sig,uchar *sigend)

{
  uchar uVar1;
  uchar *puVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int overflow;
  size_t rlen;
  uchar ra [32];
  int local_54;
  ulong local_50;
  uchar local_48 [40];
  
  local_54 = 0;
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  local_48[0x14] = '\0';
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  local_48[0x17] = '\0';
  local_48[0x18] = '\0';
  local_48[0x19] = '\0';
  local_48[0x1a] = '\0';
  local_48[0x1b] = '\0';
  local_48[0x1c] = '\0';
  local_48[0x1d] = '\0';
  local_48[0x1e] = '\0';
  local_48[0x1f] = '\0';
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  puVar2 = *sig;
  iVar4 = 0;
  iVar5 = 0;
  if ((puVar2 != sigend) && (iVar5 = iVar4, *puVar2 == '\x02')) {
    *sig = puVar2 + 1;
    iVar4 = secp256k1_der_read_len(&local_50,sig,sigend);
    if ((((iVar4 != 0) &&
         ((local_50 != 0 && (puVar2 = *sig, local_50 <= (ulong)((long)sigend - (long)puVar2))))) &&
        ((uVar1 = *puVar2, local_50 == 1 || uVar1 != '\0' || ((char)puVar2[1] < '\0')))) &&
       ((local_50 == 1 || uVar1 != 0xff || (-1 < (char)puVar2[1])))) {
      if ((char)uVar1 < '\0') {
        local_54 = 1;
      }
      if (*puVar2 == '\0') {
        local_50 = local_50 - 1;
        *sig = puVar2 + 1;
      }
      uVar3 = local_50;
      if (0x20 < local_50) {
        local_54 = 1;
      }
      if (local_54 == 0) {
        if (local_50 != 0) {
          memcpy(local_48 + (0x20 - local_50),*sig,local_50);
        }
        secp256k1_scalar_set_b32(r,local_48,&local_54);
      }
      if (local_54 != 0) {
        r->d[2] = 0;
        r->d[3] = 0;
        r->d[0] = 0;
        r->d[1] = 0;
      }
      *sig = *sig + uVar3;
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

static int secp256k1_der_parse_integer(secp256k1_scalar *r, const unsigned char **sig, const unsigned char *sigend) {
    int overflow = 0;
    unsigned char ra[32] = {0};
    size_t rlen;

    if (*sig == sigend || **sig != 0x02) {
        /* Not a primitive integer (X.690-0207 8.3.1). */
        return 0;
    }
    (*sig)++;
    if (secp256k1_der_read_len(&rlen, sig, sigend) == 0) {
        return 0;
    }
    if (rlen == 0 || rlen > (size_t)(sigend - *sig)) {
        /* Exceeds bounds or not at least length 1 (X.690-0207 8.3.1).  */
        return 0;
    }
    if (**sig == 0x00 && rlen > 1 && (((*sig)[1]) & 0x80) == 0x00) {
        /* Excessive 0x00 padding. */
        return 0;
    }
    if (**sig == 0xFF && rlen > 1 && (((*sig)[1]) & 0x80) == 0x80) {
        /* Excessive 0xFF padding. */
        return 0;
    }
    if ((**sig & 0x80) == 0x80) {
        /* Negative. */
        overflow = 1;
    }
    /* There is at most one leading zero byte:
     * if there were two leading zero bytes, we would have failed and returned 0
     * because of excessive 0x00 padding already. */
    if (rlen > 0 && **sig == 0) {
        /* Skip leading zero byte */
        rlen--;
        (*sig)++;
    }
    if (rlen > 32) {
        overflow = 1;
    }
    if (!overflow) {
        if (rlen) memcpy(ra + 32 - rlen, *sig, rlen);
        secp256k1_scalar_set_b32(r, ra, &overflow);
    }
    if (overflow) {
        secp256k1_scalar_set_int(r, 0);
    }
    (*sig) += rlen;
    return 1;
}